

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_small_vector.cpp
# Opt level: O0

void __thiscall SmallVector_CtorCopy_Test::TestBody(SmallVector_CtorCopy_Test *this)

{
  initializer_list<int> init;
  bool bVar1;
  char *pcVar2;
  _Tuple_impl<0UL,_int,_int> in_stack_fffffffffffffec0;
  AssertHelper local_110;
  Message local_108;
  int local_100 [2];
  testing local_f8 [8];
  char local_f0 [8];
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  size_t local_c8;
  uint local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_98 [8];
  small_vector<int,_3UL> c;
  undefined1 local_48 [8];
  small_vector<int,_3UL> b;
  SmallVector_CtorCopy_Test *this_local;
  
  c.buffer_._0_4_ = 3;
  c.buffer_._4_4_ = 5;
  init._M_len = 2;
  init._M_array = (iterator)&c.buffer_;
  b.buffer_ = (int *)this;
  pstore::small_vector<int,_3UL>::small_vector((small_vector<int,_3UL> *)local_48,init);
  pstore::small_vector<int,_3UL>::small_vector
            ((small_vector<int,_3UL> *)local_98,(small_vector<int,_3UL> *)local_48);
  local_bc = 2;
  local_c8 = pstore::small_vector<int,_3UL>::size((small_vector<int,_3UL> *)local_98);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((EqHelper *)local_b8,"2U","c.size ()",&local_bc,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x43,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_100[1] = 3;
  local_100[0] = 5;
  testing::ElementsAre<int,int>(local_f8,local_100 + 1,local_100);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>
            ((ElementsAreMatcher<std::tuple<int,_int>_>)in_stack_fffffffffffffec0);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int>>>::
  operator()(local_e8,local_f0,(small_vector<int,_3UL> *)0x2b3ec1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_small_vector.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  pstore::small_vector<int,_3UL>::~small_vector((small_vector<int,_3UL> *)local_98);
  pstore::small_vector<int,_3UL>::~small_vector((small_vector<int,_3UL> *)local_48);
  return;
}

Assistant:

TEST (SmallVector, CtorCopy) {
    pstore::small_vector<int, 3> const b{3, 5};
    pstore::small_vector<int, 3> c = b;
    EXPECT_EQ (2U, c.size ());
    EXPECT_THAT (c, ::testing::ElementsAre (3, 5));
}